

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O2

int Cec_SequentialSynthesisPart(Gia_Man_t *p,Cec_ParSeq_t *pPars)

{
  uint uVar1;
  Vec_Vec_t *pVVar2;
  Vec_Int_t *vPart;
  uint level;
  Gia_Man_t *p_00;
  abctime aVar3;
  size_t __size;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int *__ptr;
  int nCountPis;
  int *pMapBack;
  int nCountRegs;
  int *local_a0;
  Gia_Man_t *local_98;
  abctime local_90;
  Cec_ParCor_t CorPars;
  
  pVVar2 = p->vClockDoms;
  local_90 = Abc_Clock();
  __size = (long)p->nObjs << 2;
  local_98 = p;
  local_a0 = (int *)malloc(__size);
  memset(local_a0,0xff,__size);
  uVar5 = 0;
  do {
    __ptr = local_a0;
    if ((long)pVVar2->nSize <= (long)uVar5) {
      Gia_ManNormalizeEquivalences(local_98,local_a0);
      free(__ptr);
      iVar6 = (int)__ptr;
      if (pPars->fVerbose != 0) {
        aVar3 = Abc_Clock();
        lVar4 = aVar3 - local_90;
        Abc_Print(iVar6,"%s =","Total time");
        Abc_Print(iVar6,"%9.2f sec\n",(double)lVar4 / 1000000.0);
      }
      return 1;
    }
    vPart = (Vec_Int_t *)pVVar2->pArray[uVar5];
    p_00 = Gia_ManRegCreatePart(local_98,vPart,&nCountPis,&nCountRegs,&pMapBack);
    if (0 < nCountPis) {
      if (pPars->fUseScorr == 0) {
        if (pPars->fUseLcorr != 0) {
          Cec_ManCorSetDefaultParams(&CorPars);
          CorPars.fLatchCorr = 1;
          CorPars.nBTLimit = pPars->nBTLimit;
          CorPars.fVerbose = pPars->fVeryVerbose;
          goto LAB_004bf8f4;
        }
        Gia_ManSeqCleanupClasses(p_00,pPars->fConsts,pPars->fEquivs,pPars->fVerbose);
      }
      else {
        Cec_ManCorSetDefaultParams(&CorPars);
        CorPars.nBTLimit = pPars->nBTLimit;
        CorPars.nLevelMax = pPars->nLevelMax;
        CorPars.fVerbose = pPars->fVeryVerbose;
LAB_004bf8f4:
        CorPars.fUseCSat = 1;
        Cec_ManLSCorrespondenceClasses(p_00,&CorPars);
      }
      level = Gia_TransferMappedClasses(p_00,pMapBack,local_a0);
      if (pPars->fVerbose != 0) {
        uVar1 = vPart->nSize;
        iVar6 = p_00->vCis->nSize;
        Abc_Print(level,
                  "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. Cl = %5d.\n",
                  uVar5 & 0xffffffff,(ulong)uVar1,(ulong)(iVar6 - uVar1),(ulong)(uint)nCountPis,
                  (ulong)(uint)nCountRegs,(ulong)(uint)(~(iVar6 + p_00->vCos->nSize) + p_00->nObjs),
                  (ulong)level);
      }
    }
    Gia_ManStop(p_00);
    if (pMapBack != (int *)0x0) {
      free(pMapBack);
      pMapBack = (int *)0x0;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int Cec_SequentialSynthesisPart( Gia_Man_t * p, Cec_ParSeq_t * pPars )
{
    int fPrintParts = 0;
    char Buffer[100];
    Gia_Man_t * pTemp;
    Vec_Ptr_t * vParts = (Vec_Ptr_t *)p->vClockDoms;
    Vec_Int_t * vPart;
    int * pMapBack, * pReprs;
    int i, nCountPis, nCountRegs;
    int nClasses;
    abctime clk = Abc_Clock();

    // save parameters
    if ( fPrintParts )
    {
        // print partitions
        Abc_Print( 1, "The following clock domains are used:\n" );
        Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
        {
            pTemp = Gia_ManRegCreatePart( p, vPart, &nCountPis, &nCountRegs, NULL );
            sprintf( Buffer, "part%03d.aig", i );
            Gia_AigerWrite( pTemp, Buffer, 0, 0 );
            Abc_Print( 1, "part%03d.aig : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d.\n", 
                i, Vec_IntSize(vPart), Gia_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Gia_ManAndNum(pTemp) );
            Gia_ManStop( pTemp );
        }
    }

    // perform sequential synthesis for clock domains
    pReprs = ABC_FALLOC( int, Gia_ManObjNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        pTemp = Gia_ManRegCreatePart( p, vPart, &nCountPis, &nCountRegs, &pMapBack );
        if ( nCountPis > 0 ) 
        {
            if ( pPars->fUseScorr )
            {
                Cec_ParCor_t CorPars, * pCorPars = &CorPars;
                Cec_ManCorSetDefaultParams( pCorPars );
                pCorPars->nBTLimit   = pPars->nBTLimit;
                pCorPars->nLevelMax  = pPars->nLevelMax;
                pCorPars->fVerbose   = pPars->fVeryVerbose;
                pCorPars->fUseCSat   = 1;
                Cec_ManLSCorrespondenceClasses( pTemp, pCorPars );
            }
            else if ( pPars->fUseLcorr )
            {
                Cec_ParCor_t CorPars, * pCorPars = &CorPars;
                Cec_ManCorSetDefaultParams( pCorPars );
                pCorPars->fLatchCorr = 1;
                pCorPars->nBTLimit   = pPars->nBTLimit;
                pCorPars->fVerbose   = pPars->fVeryVerbose;
                pCorPars->fUseCSat   = 1;
                Cec_ManLSCorrespondenceClasses( pTemp, pCorPars );
            }
            else
            {
//                pNew = Gia_ManSeqStructSweep( pTemp, pPars->fConsts, pPars->fEquivs, pPars->fVerbose );
//                Gia_ManStop( pNew );
                Gia_ManSeqCleanupClasses( pTemp, pPars->fConsts, pPars->fEquivs, pPars->fVerbose );
            }
//Abc_Print( 1, "Part equivalences = %d.\n", Gia_ManEquivCountLitsAll(pTemp) );
            nClasses = Gia_TransferMappedClasses( pTemp, pMapBack, pReprs );
            if ( pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. Cl = %5d.\n", 
                    i, Vec_IntSize(vPart), Gia_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Gia_ManAndNum(pTemp), nClasses );
            }
        }
        Gia_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }

    // generate resulting equivalences
    Gia_ManNormalizeEquivalences( p, pReprs );
//Abc_Print( 1, "Total equivalences = %d.\n", Gia_ManEquivCountLitsAll(p) );
    ABC_FREE( pReprs );
    if ( pPars->fVerbose )
    {
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    }
    return 1;
}